

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O2

int ecp_mod_p521(mbedtls_mpi *N)

{
  ulong *puVar1;
  mbedtls_mpi_uint *pmVar2;
  int iVar3;
  ulong uVar4;
  mbedtls_mpi M;
  mbedtls_mpi local_80;
  mbedtls_mpi_uint Mp [10];
  
  iVar3 = 0;
  if (8 < N->n) {
    local_80.s = 1;
    uVar4 = N->n - 8;
    local_80.n = 10;
    if (uVar4 < 10) {
      local_80.n = uVar4;
    }
    local_80.p = Mp;
    memcpy(local_80.p,N->p + 8,(ulong)(uint)((int)local_80.n << 3));
    uVar4 = 9;
    iVar3 = mbedtls_mpi_shift_r(&local_80,9);
    if (iVar3 == 0) {
      pmVar2 = N->p;
      puVar1 = pmVar2 + 8;
      *puVar1 = *puVar1 & 0x1ff;
      for (; uVar4 < N->n; uVar4 = uVar4 + 1) {
        pmVar2[uVar4] = 0;
      }
      iVar3 = mbedtls_mpi_add_abs(N,N,&local_80);
    }
  }
  return iVar3;
}

Assistant:

static int ecp_mod_p521( mbedtls_mpi *N )
{
    int ret;
    size_t i;
    mbedtls_mpi M;
    mbedtls_mpi_uint Mp[P521_WIDTH + 1];
    /* Worst case for the size of M is when mbedtls_mpi_uint is 16 bits:
     * we need to hold bits 513 to 1056, which is 34 limbs, that is
     * P521_WIDTH + 1. Otherwise P521_WIDTH is enough. */

    if( N->n < P521_WIDTH )
        return( 0 );

    /* M = A1 */
    M.s = 1;
    M.n = N->n - ( P521_WIDTH - 1 );
    if( M.n > P521_WIDTH + 1 )
        M.n = P521_WIDTH + 1;
    M.p = Mp;
    memcpy( Mp, N->p + P521_WIDTH - 1, M.n * sizeof( mbedtls_mpi_uint ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &M, 521 % ( 8 * sizeof( mbedtls_mpi_uint ) ) ) );

    /* N = A0 */
    N->p[P521_WIDTH - 1] &= P521_MASK;
    for( i = P521_WIDTH; i < N->n; i++ )
        N->p[i] = 0;

    /* N = A0 + A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( N, N, &M ) );

cleanup:
    return( ret );
}